

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::FixedCol::undo
          (FixedCol *this,HighsOptions *options,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *colValues,HighsSolution *solution,HighsBasis *basis)

{
  HighsBasisStatus HVar1;
  int iVar2;
  pointer pNVar3;
  pointer pdVar4;
  pointer pHVar5;
  Nonzero *colVal;
  pointer pNVar6;
  HighsCDouble reducedCost;
  HighsCDouble local_40;
  
  (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[this->col] = this->fixValue;
  if (solution->dual_valid == true) {
    local_40.hi = this->colCost;
    local_40.lo = 0.0;
    pNVar3 = (colValues->
             super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pNVar6 = (colValues->
                  super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  )._M_impl.super__Vector_impl_data._M_start; pNVar6 != pNVar3; pNVar6 = pNVar6 + 1)
    {
      pdVar4 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(long)pNVar6->index <
          (ulong)((long)(solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
        HighsCDouble::operator-=(&local_40,pNVar6->value * pdVar4[pNVar6->index]);
      }
    }
    iVar2 = this->col;
    (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar2] = local_40.hi + local_40.lo;
    if (basis->valid != false) {
      HVar1 = this->fixType;
      pHVar5 = (basis->col_status).
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      pHVar5[iVar2] = HVar1;
      if (HVar1 == kNonbasic) {
        pHVar5[iVar2] = (local_40.hi + local_40.lo < 0.0) * '\x02';
      }
    }
  }
  return;
}

Assistant:

void HighsPostsolveStack::FixedCol::undo(const HighsOptions& options,
                                         const std::vector<Nonzero>& colValues,
                                         HighsSolution& solution,
                                         HighsBasis& basis) const {
  // set solution value
  solution.col_value[col] = fixValue;

  if (!solution.dual_valid) return;

  // compute reduced cost

  HighsCDouble reducedCost = colCost;
  for (const auto& colVal : colValues) {
    if (static_cast<size_t>(colVal.index) < solution.row_dual.size())
      reducedCost -= colVal.value * solution.row_dual[colVal.index];
  }

  solution.col_dual[col] = double(reducedCost);

  // set basis status
  if (basis.valid) {
    basis.col_status[col] = fixType;
    if (basis.col_status[col] == HighsBasisStatus::kNonbasic)
      basis.col_status[col] = solution.col_dual[col] >= 0
                                  ? HighsBasisStatus::kLower
                                  : HighsBasisStatus::kUpper;
  }
}